

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O1

void __thiscall
QPicturePaintEngine::writeCmdLength(QPicturePaintEngine *this,int pos,QRectF *r,bool corr)

{
  QPaintEnginePrivate *this_00;
  QPaintEnginePrivate *pQVar1;
  long lVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  bool bVar6;
  int iVar7;
  undefined8 *puVar8;
  QPainter *pQVar9;
  QPen *this_01;
  QTransform *this_02;
  int iVar10;
  int iVar11;
  uint uVar12;
  long in_FS_OFFSET;
  int iVar13;
  double dVar14;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  double dVar15;
  int iVar19;
  undefined1 auVar18 [16];
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dStack_b0;
  double dStack_a0;
  QRectF local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngine).d_ptr.d;
  iVar7 = QBuffer::pos();
  uVar12 = iVar7 - pos;
  local_78.xp = r->xp;
  local_78.yp = r->yp;
  local_78.w = r->w;
  local_78.h = r->h;
  if ((int)uVar12 < 0xff) {
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)(pQVar1 + 1),(int)(char)uVar12);
  }
  else {
    this_00 = pQVar1 + 1;
    QDataStream::operator<<((QDataStream *)this_00,0);
    QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
    QDataStream::operator<<((QDataStream *)this_00,0xffffffff);
    puVar8 = (undefined8 *)QBuffer::buffer();
    if (((int *)*puVar8 == (int *)0x0) || (1 < *(int *)*puVar8)) {
      QByteArray::reallocData((longlong)puVar8,(AllocationOption)puVar8[2]);
    }
    memmove((void *)(puVar8[1] + (long)pos + 4),(void *)(puVar8[1] + (long)pos),(ulong)uVar12);
    QDataStream::operator<<((QDataStream *)this_00,uVar12);
  }
  QBuffer::seek(*(long *)&pQVar1[1].systemRect + 8);
  if ((0.0 < local_78.w) || (0.0 < local_78.h)) {
    if (corr) {
      pQVar9 = QPaintEngine::painter(&this->super_QPaintEngine);
      this_01 = QPainter::pen(pQVar9);
      iVar7 = QPen::width(this_01);
      dVar14 = (double)(iVar7 / 2);
      local_78.w = (local_78.xp + local_78.w + dVar14) - (local_78.xp - dVar14);
      local_78.h = (local_78.yp + local_78.h + dVar14) - (local_78.yp - dVar14);
      local_78.xp = local_78.xp - dVar14;
      local_78.yp = local_78.yp - dVar14;
    }
    pQVar9 = QPaintEngine::painter(&this->super_QPaintEngine);
    this_02 = QPainter::transform(pQVar9);
    QTransform::mapRect(&local_58,this_02,&local_78);
    local_78.w = local_58.w;
    local_78.h = local_58.h;
    local_78.xp = local_58.xp;
    local_78.yp = local_58.yp;
    pQVar9 = QPaintEngine::painter(&this->super_QPaintEngine);
    bVar6 = QPainter::hasClipping(pQVar9);
    if (bVar6) {
      local_98.w._0_4_ = 0xffffffff;
      local_98.w._4_4_ = 0xffffffff;
      local_98.h._0_4_ = 0xffffffff;
      local_98.h._4_4_ = 0xffffffff;
      local_98.xp._0_4_ = 0xffffffff;
      local_98.xp._4_4_ = 0xffffffff;
      local_98.yp._0_4_ = 0xffffffff;
      local_98.yp._4_4_ = 0xffffffff;
      pQVar9 = QPaintEngine::painter(&this->super_QPaintEngine);
      QPainter::clipBoundingRect(&local_98,pQVar9);
      QRectF::operator&(&local_58,&local_78);
      local_78.w = local_58.w;
      local_78.h = local_58.h;
      local_78.xp = local_58.xp;
      local_78.yp = local_58.yp;
    }
    qVar5 = local_78.w;
    qVar4 = local_78.yp;
    qVar3 = local_78.xp;
    if ((0.0 < local_78.w) || (0.0 < local_78.h)) {
      auVar17._8_8_ = local_78.yp;
      auVar17._0_8_ = local_78.xp;
      auVar17 = minpd(_DAT_00684790,auVar17);
      auVar17 = maxpd(auVar17,_DAT_006847a0);
      dVar14 = floor(auVar17._0_8_);
      dStack_a0 = auVar17._8_8_;
      dVar15 = floor(dStack_a0);
      iVar13 = (int)dVar14;
      iVar19 = (int)dVar15;
      auVar21._8_8_ = local_78.h + qVar4;
      auVar21._0_8_ = qVar5 + qVar3;
      auVar17 = minpd(_DAT_00684790,auVar21);
      auVar17 = maxpd(auVar17,_DAT_006847a0);
      dVar14 = ceil(auVar17._0_8_);
      dStack_b0 = auVar17._8_8_;
      dVar15 = ceil(dStack_b0);
      auVar18._0_4_ = (int)dVar14;
      auVar18._4_4_ = (int)dVar15;
      auVar18._8_8_ = 0;
      lVar2 = *(long *)&pQVar1[1].systemRect;
      iVar7 = *(int *)(lVar2 + 0x28);
      iVar10 = *(int *)(lVar2 + 0x30) + 1;
      if ((iVar10 - iVar7 < 1) && ((*(int *)(lVar2 + 0x34) - *(int *)(lVar2 + 0x2c)) + 1 < 1)) {
        uVar16 = CONCAT44(auVar18._4_4_ + -1,auVar18._0_4_ + -1);
        uVar20 = CONCAT44(iVar19,iVar13);
      }
      else {
        iVar11 = *(int *)(lVar2 + 0x34) + 1;
        uVar20 = CONCAT44(-(uint)(*(int *)(lVar2 + 0x2c) < iVar19),-(uint)(iVar7 < iVar13));
        uVar20 = ~uVar20 & CONCAT44(iVar19,iVar13) | CONCAT44(*(int *)(lVar2 + 0x2c),iVar7) & uVar20
        ;
        auVar23._0_8_ = CONCAT44(-(uint)(auVar18._4_4_ < iVar11),-(uint)(auVar18._0_4_ < iVar10));
        auVar23._8_8_ = 0;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = CONCAT44(iVar11,iVar10) & auVar23._0_8_;
        auVar22 = ~auVar23 & auVar18 | auVar22;
        uVar16 = CONCAT44(auVar22._4_4_ + -1,auVar22._0_4_ + -1);
      }
      *(ulong *)(lVar2 + 0x28) = uVar20;
      *(undefined8 *)(lVar2 + 0x30) = uVar16;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::writeCmdLength(int pos, const QRectF &r, bool corr)
{
    Q_D(QPicturePaintEngine);
    int newpos = d->pic_d->pictb.pos();            // new position
    int length = newpos - pos;
    QRectF br(r);

    if (length < 255) {                         // write 8-bit length
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)length;
    } else {                                    // write 32-bit length
        d->s << (quint32)0;                    // extend the buffer
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)255;                   // indicate 32-bit length
        char *p = d->pic_d->pictb.buffer().data();
        memmove(p+pos+4, p+pos, length);        // make room for 4 byte
        d->s << (quint32)length;
        newpos += 4;
    }
    d->pic_d->pictb.seek(newpos);                  // set to new position

    if (br.width() > 0.0 || br.height() > 0.0) {
        if (corr) {                             // widen bounding rect
            int w2 = painter()->pen().width() / 2;
            br.setCoords(br.left() - w2, br.top() - w2,
                         br.right() + w2, br.bottom() + w2);
        }
        br = painter()->transform().mapRect(br);
        if (painter()->hasClipping()) {
            QRectF cr = painter()->clipBoundingRect();
            br &= cr;
        }

        if (br.width() > 0.0 || br.height() > 0.0) {
            const auto clampToIntRange = [](qreal v)
            {
                return qBound(qreal((std::numeric_limits<int>::min)()),
                              v,
                              qreal((std::numeric_limits<int>::max)()));
            };
            int minx = qFloor(clampToIntRange(br.left()));
            int miny = qFloor(clampToIntRange(br.top()));
            int maxx = qCeil(clampToIntRange(br.right()));
            int maxy = qCeil(clampToIntRange(br.bottom()));

            if (d->pic_d->brect.width() > 0 || d->pic_d->brect.height() > 0) {
                minx = qMin(minx, d->pic_d->brect.left());
                miny = qMin(miny, d->pic_d->brect.top());
                maxx = qMax(maxx, d->pic_d->brect.x() + d->pic_d->brect.width());
                maxy = qMax(maxy, d->pic_d->brect.y() + d->pic_d->brect.height());
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            } else {
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            }
        }
    }
}